

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

void __thiscall flow::IRHandler::~IRHandler(IRHandler *this)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  undefined8 *puVar1;
  iterator i;
  const_iterator __position;
  undefined8 *puVar2;
  _List_node_base *p_Var3;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__IRHandler_00195080;
  this_00 = &this->blocks_;
  p_Var3 = (_List_node_base *)this_00;
  while (p_Var3 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)this_00) {
    puVar1 = *(undefined8 **)((long)p_Var3[1]._M_next + 0x58);
    for (puVar2 = *(undefined8 **)((long)p_Var3[1]._M_next + 0x50); puVar2 != puVar1;
        puVar2 = puVar2 + 1) {
      Instr::clearOperands((Instr *)*puVar2);
    }
  }
  while (__position._M_node =
              (this_00->
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next,
        __position._M_node != (_List_node_base *)this_00) {
    while (__position._M_node != (_List_node_base *)this_00) {
      if (__position._M_node[1]._M_next[6]._M_prev == __position._M_node[1]._M_next[7]._M_next) {
        __position._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
             ::erase(this_00,__position);
      }
      else {
        __position._M_node = (__position._M_node)->_M_next;
      }
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            );
  Value::~Value((Value *)this);
  return;
}

Assistant:

IRHandler::~IRHandler() {
  for (BasicBlock* bb : basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      instr->clearOperands();
    }
  }

  while (!blocks_.empty()) {
    auto i = blocks_.begin();
    auto e = blocks_.end();

    while (i != e) {
      BasicBlock* bb = i->get();

      if (bb->predecessors().empty()) {
        i = blocks_.erase(i);
      } else {
        // skip BBs that other BBs still point to (we never point to ourself).
        ++i;
      }
    }
  }
}